

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

void Saig_BmcDeriveFailed(Saig_Bmc_t *p,int iTargetFail)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = p->iOutputLast;
  p->iOutputFail = iVar2;
  iVar1 = p->iFrameLast;
  p->iFrameFail = iVar1;
  for (iVar3 = p->vTargets->nSize; iTargetFail < iVar3; iVar3 = iVar3 + -1) {
    if (iVar2 == 0) {
      iVar2 = p->pAig->nTruePos;
      iVar1 = iVar1 + -1;
      p->iFrameFail = iVar1;
    }
    iVar2 = iVar2 + -1;
    p->iOutputFail = iVar2;
  }
  return;
}

Assistant:

void Saig_BmcDeriveFailed( Saig_Bmc_t * p, int iTargetFail )
{
    int k;
    p->iOutputFail = p->iOutputLast;
    p->iFrameFail  = p->iFrameLast;
    for ( k = Vec_PtrSize(p->vTargets); k > iTargetFail; k-- )
    {
        if ( p->iOutputFail == 0 )
        {
            p->iOutputFail = Saig_ManPoNum(p->pAig);
            p->iFrameFail--;
        }
        p->iOutputFail--;
    }
}